

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffparsecompspec(fitsfile *fptr,char *compspec,int *status)

{
  byte bVar1;
  ushort *puVar2;
  bool bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  ushort **ppuVar7;
  long lVar8;
  byte bVar9;
  uint smooth;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  float fVar14;
  long tilesize [6];
  byte *local_80;
  int local_78;
  float local_74;
  fitsfile *local_70;
  long local_68 [7];
  
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  pbVar10 = (byte *)(compspec + -1);
  do {
    pbVar12 = pbVar10;
    pbVar10 = pbVar12 + 1;
  } while (pbVar12[1] == 0x20);
  local_80 = pbVar10;
  iVar6 = strncmp((char *)pbVar10,"compress",8);
  if ((iVar6 == 0) || (iVar6 = strncmp((char *)pbVar10,"COMPRESS",8), iVar6 == 0)) {
    pbVar12 = pbVar12 + 10;
    while( true ) {
      local_80 = pbVar12 + -1;
      bVar9 = pbVar12[-1];
      if (bVar9 != 0x20) break;
      pbVar12 = pbVar12 + 1;
    }
    if (bVar9 < 0x67) {
      if (0x4f < bVar9) {
        if (bVar9 != 0x50) {
          if (bVar9 == 0x52) {
LAB_0011be04:
            while ((0x3b < (ulong)*local_80 ||
                   ((0x800000100000001U >> ((ulong)*local_80 & 0x3f) & 1) == 0))) {
              local_80 = local_80 + 1;
            }
          }
          goto LAB_0011be37;
        }
LAB_0011be76:
        while ((0x3b < (ulong)*local_80 ||
               ((0x800000100000001U >> ((ulong)*local_80 & 0x3f) & 1) == 0))) {
          local_80 = local_80 + 1;
        }
        local_78 = 0x1f;
        goto LAB_0011beac;
      }
      if (bVar9 == 0x47) {
LAB_0011be53:
        while ((0x3b < (ulong)*local_80 ||
               ((0x800000100000001U >> ((ulong)*local_80 & 0x3f) & 1) == 0))) {
          local_80 = local_80 + 1;
        }
        local_78 = 0x15;
        goto LAB_0011beac;
      }
      if (bVar9 != 0x48) goto LAB_0011be37;
LAB_0011bdb2:
      bVar9 = *pbVar12;
      while ((0x3b < (ulong)*pbVar12 || ((0x800000100000001U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
            ) {
        pbVar12 = pbVar12 + 1;
      }
      smooth = (uint)((bVar9 + 0xad & 0xdf) == 0);
      local_78 = 0x29;
      bVar5 = true;
      local_80 = pbVar12;
    }
    else {
      if (bVar9 < 0x70) {
        if (bVar9 == 0x67) goto LAB_0011be53;
        if (bVar9 == 0x68) goto LAB_0011bdb2;
      }
      else {
        if (bVar9 == 0x70) goto LAB_0011be76;
        if (bVar9 == 0x72) goto LAB_0011be04;
      }
LAB_0011be37:
      local_78 = 0xb;
LAB_0011beac:
      bVar5 = false;
      smooth = 0;
    }
    pbVar10 = local_80 + -1;
    do {
      pbVar12 = pbVar10 + 1;
      pbVar10 = pbVar10 + 1;
    } while (*pbVar12 == 0x20);
    local_80 = pbVar10;
    ppuVar7 = __ctype_b_loc();
    puVar2 = *ppuVar7;
    bVar9 = *pbVar10;
    if ((*(byte *)((long)puVar2 + (long)(char)bVar9 * 2 + 1) & 8) != 0) {
      uVar13 = 0;
      local_70 = fptr;
      do {
        lVar8 = atol((char *)pbVar10);
        local_68[uVar13] = lVar8;
        pbVar10 = pbVar10 + -1;
        do {
          pbVar12 = pbVar10;
          bVar1 = pbVar12[1];
          pbVar10 = pbVar12 + 1;
        } while ((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) != 0);
        uVar11 = (ulong)(bVar1 == 0x2c);
        do {
          pbVar10 = pbVar12 + uVar11 + 1;
          pbVar12 = pbVar12 + 1;
        } while (*pbVar10 == 0x20);
        bVar9 = pbVar12[uVar11];
        if ((*(byte *)((long)puVar2 + (long)(char)bVar9 * 2 + 1) & 8) == 0) break;
        pbVar10 = pbVar12 + uVar11;
        bVar3 = uVar13 < 8;
        uVar13 = uVar13 + 1;
      } while (bVar3);
      pbVar10 = pbVar12 + (bVar1 == 0x2c);
      fptr = local_70;
    }
    if (bVar9 == 0x3b) {
      do {
        pbVar10 = pbVar10 + 1;
      } while (*pbVar10 == 0x20);
      local_74 = 0.0;
      iVar6 = 1;
      fVar14 = -99.0;
      local_80 = pbVar10;
LAB_0011bf99:
      while( true ) {
        bVar9 = *local_80;
        if (bVar9 < 0x71) break;
        if (bVar9 == 0x71) goto LAB_0011c009;
        if (bVar9 != 0x73) goto LAB_0011bd52;
LAB_0011bfc3:
        local_70 = (fitsfile *)CONCAT44(local_70._4_4_,fVar14);
        do {
          pbVar10 = local_80 + 1;
          local_80 = local_80 + 1;
        } while (*pbVar10 == 0x20);
        dVar4 = strtod((char *)local_80,(char **)&local_80);
        for (; (*local_80 == 0x2c || (*local_80 == 0x20)); local_80 = local_80 + 1) {
        }
        local_74 = (float)dVar4;
        fVar14 = local_70._0_4_;
      }
      if (bVar9 == 0x51) {
LAB_0011c009:
        bVar9 = local_80[1];
        if (bVar9 == 0x30) {
          iVar6 = -1;
          pbVar10 = local_80 + 2;
        }
        else if ((bVar9 == 0x7a) || (pbVar10 = local_80 + 1, bVar9 == 0x5a)) {
          iVar6 = 2;
          pbVar10 = local_80 + 2;
        }
        local_80 = pbVar10;
        local_80 = local_80 + -1;
        do {
          pbVar10 = local_80 + 1;
          local_80 = local_80 + 1;
        } while (*pbVar10 == 0x20);
        dVar4 = strtod((char *)local_80,(char **)&local_80);
        for (; (*local_80 == 0x2c || (*local_80 == 0x20)); local_80 = local_80 + 1) {
        }
        fVar14 = (float)dVar4;
        goto LAB_0011bf99;
      }
      if (bVar9 == 0x53) goto LAB_0011bfc3;
      if (bVar9 != 0) goto LAB_0011bd52;
      local_70 = (fitsfile *)CONCAT44(local_70._4_4_,fVar14);
    }
    else {
      local_74 = 0.0;
      local_70 = (fitsfile *)CONCAT44(local_70._4_4_,0xc2c60000);
      iVar6 = 1;
      local_80 = pbVar10;
    }
    fits_set_compression_type(fptr,local_78,status);
    fits_set_tile_dim(fptr,6,local_68,status);
    if (bVar5) {
      fits_set_hcomp_scale(fptr,local_74,status);
      fits_set_hcomp_smooth(fptr,smooth,status);
    }
    if ((local_70._0_4_ != -99.0) || (NAN(local_70._0_4_))) {
      fits_set_quantize_level(fptr,local_70._0_4_,status);
      fits_set_quantize_method(fptr,iVar6,status);
    }
    iVar6 = *status;
  }
  else {
LAB_0011bd52:
    *status = 0x7d;
    iVar6 = 0x7d;
  }
  return iVar6;
}

Assistant:

int ffparsecompspec(fitsfile *fptr,  /* I - FITS file pointer               */
           char *compspec,     /* I - image compression specification */
           int *status)          /* IO - error status                       */
/*
  Parse the image compression specification that was give in square brackets
  following the output FITS file name, as in these examples:

    myfile.fits[compress]  - default Rice compression, row by row 
    myfile.fits[compress TYPE] -  the first letter of TYPE defines the
                                  compression algorithm:
                                   R = Rice
                                   G = GZIP
                                   H = HCOMPRESS
                                   HS = HCOMPRESS (with smoothing)
				   B - BZIP2
                                   P = PLIO

    myfile.fits[compress TYPE 100,100] - the numbers give the dimensions
                                         of the compression tiles.  Default
                                         is NAXIS1, 1, 1, ...

       other optional parameters may be specified following a semi-colon 
       
    myfile.fits[compress; q 8.0]          q specifies the floating point 
    mufile.fits[compress TYPE; q -.0002]        quantization level;
    myfile.fits[compress TYPE 100,100; q 10, s 25]  s specifies the HCOMPRESS
                                                     integer scaling parameter

The compression parameters are saved in the fptr->Fptr structure for use
when writing FITS images.

*/
{
    char *ptr1;

    /* initialize with default values */
    int ii, compresstype = RICE_1, smooth = 0;
    int quantize_method = SUBTRACTIVE_DITHER_1;
    long tilesize[MAX_COMPRESS_DIM] = {0,0,0,0,0,0};
    float qlevel = -99., scale = 0.;
    
    ptr1 = compspec;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if (strncmp(ptr1, "compress", 8) && strncmp(ptr1, "COMPRESS", 8) )
    {
       /* apparently this string does not specify compression parameters */
       return(*status = URL_PARSE_ERROR);
    }

    ptr1 += 8;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    /* ========================= */
    /* look for compression type */
    /* ========================= */

    if (*ptr1 == 'r' || *ptr1 == 'R')
    {
        compresstype = RICE_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'g' || *ptr1 == 'G')
    {
        compresstype = GZIP_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
/*
    else if (*ptr1 == 'b' || *ptr1 == 'B')
    {
        compresstype = BZIP2_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
*/
    else if (*ptr1 == 'p' || *ptr1 == 'P')
    {
        compresstype = PLIO_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'h' || *ptr1 == 'H')
    {
        compresstype = HCOMPRESS_1;
        ptr1++;
        if (*ptr1 == 's' || *ptr1 == 'S')
           smooth = 1;  /* apply smoothing when uncompressing HCOMPRESSed image */

        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }

    /* ======================== */
    /* look for tile dimensions */
    /* ======================== */

    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    ii = 0;
    while (isdigit( (int) *ptr1) && ii < 9)
    {
       tilesize[ii] = atol(ptr1);  /* read the integer value */
       ii++;

       while (isdigit((int) *ptr1))    /* skip over the integer */
           ptr1++;

       if (*ptr1 == ',')
           ptr1++;   /* skip over the comma */
          
       while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;
    }

    /* ========================================================= */
    /* look for semi-colon, followed by other optional parameters */
    /* ========================================================= */

    if (*ptr1 == ';') {
        ptr1++;
        while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

          while (*ptr1 != 0) {  /* haven't reached end of string yet */

              if (*ptr1 == 's' || *ptr1 == 'S') {
                  /* this should be the HCOMPRESS "scale" parameter; default = 1 */
	   
                  ptr1++;
                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  scale = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else if (*ptr1 == 'q' || *ptr1 == 'Q') {
                /* this should be the floating point quantization parameter */

                  ptr1++;
                  if (*ptr1 == 'z' || *ptr1 == 'Z') {
                      /* use the subtractive_dither_2 option */
                      quantize_method = SUBTRACTIVE_DITHER_2;
                      ptr1++;
		  } else if (*ptr1 == '0') {
                      /* do not dither */
                      quantize_method = NO_DITHER;
                      ptr1++;
		  }

                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  qlevel = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else {
                return(*status = URL_PARSE_ERROR);
            }
        }
    }

    /* ================================= */
    /* finished parsing; save the values */
    /* ================================= */

    fits_set_compression_type(fptr, compresstype, status);
    fits_set_tile_dim(fptr, MAX_COMPRESS_DIM, tilesize, status);
 
    if (compresstype == HCOMPRESS_1) {
        fits_set_hcomp_scale (fptr, scale,  status);
        fits_set_hcomp_smooth(fptr, smooth, status);
    }

    if (qlevel != -99.) {
        fits_set_quantize_level(fptr, qlevel, status);
        fits_set_quantize_method(fptr, quantize_method, status);
    }

    return(*status);
}